

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O3

int Abc_NodeRemoveDupFanins_int(Abc_Obj_t *pNode)

{
  Abc_Ntk_t *pAVar1;
  int *piVar2;
  void **ppvVar3;
  DdManager *dd;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *n;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  pAVar1 = pNode->pNtk;
  if ((pAVar1->ntkFunc == ABC_FUNC_BDD) && (pAVar1->ntkType == ABC_NTK_LOGIC)) {
    if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                    ,0x94,"int Abc_NodeRemoveDupFanins_int(Abc_Obj_t *)");
    }
    uVar6 = (ulong)(pNode->vFanins).nSize;
    if (0 < (long)uVar6) {
      piVar2 = (pNode->vFanins).pArray;
      ppvVar3 = pAVar1->vObjs->pArray;
      uVar7 = 0;
      do {
        if (uVar7 != 0) {
          uVar8 = 0;
          do {
            if (ppvVar3[piVar2[uVar8]] == ppvVar3[piVar2[uVar7]]) {
              dd = (DdManager *)pAVar1->pManFunc;
              pDVar4 = Cudd_bddIthVar(dd,(int)uVar7);
              pDVar5 = Cudd_bddIthVar(dd,(int)uVar8);
              n = Cudd_bddXnor(dd,pDVar4,pDVar5);
              Cudd_Ref(n);
              pDVar4 = (DdNode *)(pNode->field_5).pData;
              pDVar5 = Cudd_bddAndAbstract(dd,pDVar4,n,pDVar5);
              (pNode->field_5).pData = pDVar5;
              Cudd_Ref(pDVar5);
              Cudd_RecursiveDeref(dd,pDVar4);
              Cudd_RecursiveDeref(dd,n);
              Abc_NodeMinimumBase(pNode);
              return 1;
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < uVar7);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar6);
    }
    return 0;
  }
  __assert_fail("Abc_NtkIsBddLogic(pNode->pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                ,0x93,"int Abc_NodeRemoveDupFanins_int(Abc_Obj_t *)");
}

Assistant:

int Abc_NodeRemoveDupFanins_int( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanin1, * pFanin2;
    int i, k;
    assert( Abc_NtkIsBddLogic(pNode->pNtk) );
    assert( Abc_ObjIsNode(pNode) );
    // make sure fanins are not duplicated
    Abc_ObjForEachFanin( pNode, pFanin2, i )
    {
        Abc_ObjForEachFanin( pNode, pFanin1, k )
        {
            if ( k >= i )
                break;
            if ( pFanin1 == pFanin2 )
            {
                DdManager * dd = (DdManager *)pNode->pNtk->pManFunc;
                DdNode * bVar1 = Cudd_bddIthVar( dd, i );
                DdNode * bVar2 = Cudd_bddIthVar( dd, k );
                DdNode * bTrans, * bTemp;
                bTrans = Cudd_bddXnor( dd, bVar1, bVar2 ); Cudd_Ref( bTrans );
                pNode->pData = Cudd_bddAndAbstract( dd, bTemp = (DdNode *)pNode->pData, bTrans, bVar2 ); Cudd_Ref( (DdNode *)pNode->pData );
                Cudd_RecursiveDeref( dd, bTemp );
                Cudd_RecursiveDeref( dd, bTrans );
                Abc_NodeMinimumBase( pNode );
                return 1;
            }
        }
    }
    return 0;
}